

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async_logger-inl.h
# Opt level: O2

void __thiscall spdlog::async_logger::sink_it_(async_logger *this,log_msg *msg)

{
  async_logger_ptr aaStack_98 [2];
  shared_ptr<spdlog::details::thread_pool> pool_ptr;
  string local_40;
  
  std::__shared_ptr<spdlog::details::thread_pool,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&pool_ptr.super___shared_ptr<spdlog::details::thread_pool,_(__gnu_cxx::_Lock_policy)2>,
             &this->thread_pool_);
  if (pool_ptr.super___shared_ptr<spdlog::details::thread_pool,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      != (element_type *)0x0) {
    std::__shared_ptr<spdlog::async_logger,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<spdlog::async_logger,void>
              ((__shared_ptr<spdlog::async_logger,(__gnu_cxx::_Lock_policy)2> *)aaStack_98,
               (__weak_ptr<spdlog::async_logger,_(__gnu_cxx::_Lock_policy)2> *)
               &this->super_enable_shared_from_this<spdlog::async_logger>);
    details::thread_pool::post_log
              (pool_ptr.super___shared_ptr<spdlog::details::thread_pool,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr,aaStack_98,msg,this->overflow_policy_);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&aaStack_98[0].super___shared_ptr<spdlog::async_logger,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&pool_ptr.
                super___shared_ptr<spdlog::details::thread_pool,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    return;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"async log: thread pool doesn\'t exist anymore",
             (allocator<char> *)aaStack_98);
  throw_spdlog_ex(&local_40);
}

Assistant:

SPDLOG_INLINE void spdlog::async_logger::sink_it_(const details::log_msg &msg){
    SPDLOG_TRY{if (auto pool_ptr = thread_pool_.lock()){
        pool_ptr->post_log(shared_from_this(), msg, overflow_policy_);
}
else {
    throw_spdlog_ex("async log: thread pool doesn't exist anymore");
}
}
SPDLOG_LOGGER_CATCH(msg.source)
}